

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O0

void ucnv_toUWriteUChars_63
               (UConverter *cnv,UChar *uchars,int32_t length,UChar **target,UChar *targetLimit,
               int32_t **offsets,int32_t sourceIndex,UErrorCode *pErrorCode)

{
  int32_t *local_48;
  int32_t *o;
  UChar *t;
  int32_t **offsets_local;
  UChar *targetLimit_local;
  UChar **target_local;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *uchars_local;
  UConverter *cnv_local;
  
  o = (int32_t *)*target;
  target_local._4_4_ = length;
  pUStack_18 = uchars;
  if ((offsets == (int32_t **)0x0) || (local_48 = *offsets, local_48 == (int32_t *)0x0)) {
    for (; 0 < target_local._4_4_ && o < targetLimit; target_local._4_4_ = target_local._4_4_ + -1)
    {
      *(UChar *)o = *pUStack_18;
      o = (int32_t *)((long)o + 2);
      pUStack_18 = pUStack_18 + 1;
    }
  }
  else {
    for (; 0 < target_local._4_4_ && o < targetLimit; target_local._4_4_ = target_local._4_4_ + -1)
    {
      *(UChar *)o = *pUStack_18;
      *local_48 = sourceIndex;
      local_48 = local_48 + 1;
      o = (int32_t *)((long)o + 2);
      pUStack_18 = pUStack_18 + 1;
    }
    *offsets = local_48;
  }
  *target = (UChar *)o;
  if (0 < target_local._4_4_) {
    if (cnv != (UConverter *)0x0) {
      cnv->UCharErrorBufferLength = (int8_t)target_local._4_4_;
      o = (int32_t *)cnv->UCharErrorBuffer;
      do {
        *(UChar *)o = *pUStack_18;
        target_local._4_4_ = target_local._4_4_ + -1;
        o = (int32_t *)((long)o + 2);
        pUStack_18 = pUStack_18 + 1;
      } while (0 < target_local._4_4_);
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_toUWriteUChars(UConverter *cnv,
                    const UChar *uchars, int32_t length,
                    UChar **target, const UChar *targetLimit,
                    int32_t **offsets,
                    int32_t sourceIndex,
                    UErrorCode *pErrorCode) {
    UChar *t=*target;
    int32_t *o;

    /* write UChars */
    if(offsets==NULL || (o=*offsets)==NULL) {
        while(length>0 && t<targetLimit) {
            *t++=*uchars++;
            --length;
        }
    } else {
        /* output with offsets */
        while(length>0 && t<targetLimit) {
            *t++=*uchars++;
            *o++=sourceIndex;
            --length;
        }
        *offsets=o;
    }
    *target=t;

    /* write overflow */
    if(length>0) {
        if(cnv!=NULL) {
            t=cnv->UCharErrorBuffer;
            cnv->UCharErrorBufferLength=(int8_t)length;
            do {
                *t++=*uchars++;
            } while(--length>0);
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}